

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::internal::RegisterFileLevelMetadata(DescriptorTable *table)

{
  DescriptorPool *this;
  undefined8 local_30;
  Message **defaults;
  FileDescriptor *local_18;
  FileDescriptor *file;
  DescriptorTable *table_local;
  
  file = (FileDescriptor *)table;
  AssignDescriptors(table);
  this = DescriptorPool::internal_generated_pool();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&defaults,(char *)file->package_);
  local_18 = DescriptorPool::FindFileByName(this,_defaults);
  local_30._0_4_ = file->weak_dependency_count_;
  local_30._4_4_ = file->message_type_count_;
  cpp::
  VisitDescriptorsInFileOrder<google::protobuf::internal::RegisterFileLevelMetadata(google::protobuf::internal::DescriptorTable_const*)::__0>
            (local_18,(anon_class_8_1_0e5317d0)&local_30);
  return;
}

Assistant:

void RegisterFileLevelMetadata(const DescriptorTable* table) {
  AssignDescriptors(table);
  auto* file = DescriptorPool::internal_generated_pool()->FindFileByName(
      table->filename);
  auto defaults = table->default_instances;
  internal::cpp::VisitDescriptorsInFileOrder(file, [&](auto* desc) {
    MessageFactory::InternalRegisterGeneratedMessage(desc, *defaults);
    ++defaults;
    return std::false_type{};
  });
}